

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesXPath::XercesXPath
          (XercesXPath *this,XMLCh *xpathExpr,XMLStringPool *stringPool,
          XercesNamespaceResolver *scopeContext,uint emptyNamespaceId,bool isSelector,
          MemoryManager *manager)

{
  XMLCh *pXVar1;
  JanitorMemFunCall<xercesc_4_0::XercesXPath> local_38;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesXPath_00407a30;
  this->fEmptyNamespaceId = emptyNamespaceId;
  this->fExpression = (XMLCh *)0x0;
  this->fLocationPaths = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
  this->fMemoryManager = manager;
  local_38.fToCall = (MFPT)cleanUp;
  local_38._16_8_ = 0;
  local_38.fObject = this;
  pXVar1 = XMLString::replicate(xpathExpr,manager);
  this->fExpression = pXVar1;
  parseExpression(this,stringPool,scopeContext);
  if (isSelector) {
    checkForSelectedAttributes(this);
  }
  local_38.fObject = (XercesXPath *)0x0;
  JanitorMemFunCall<xercesc_4_0::XercesXPath>::~JanitorMemFunCall(&local_38);
  return;
}

Assistant:

XercesXPath::XercesXPath(const XMLCh* const xpathExpr,
                         XMLStringPool* const stringPool,
                         XercesNamespaceResolver* const scopeContext,
                         const unsigned int emptyNamespaceId,
                         const bool isSelector,
                         MemoryManager* const manager)
    : fEmptyNamespaceId(emptyNamespaceId)
    , fExpression(0)
    , fLocationPaths(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XercesXPath::cleanUp);

    try
    {
        fExpression = XMLString::replicate(xpathExpr, fMemoryManager);
        parseExpression(stringPool, scopeContext);

        if (isSelector) {
            checkForSelectedAttributes();
        }
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}